

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Callback.hpp
# Opt level: O1

void __thiscall Callback::Emitter::emit<MyEmitter>(Emitter *this,offset_in_MyEmitter_to_subr signal)

{
  code *pcVar1;
  SignalActivation activation;
  SignalActivation local_60;
  Memory local_38 [16];
  offset_in_MyEmitter_to_subr local_28 [2];
  
  local_28[0] = signal;
  Memory::copy(local_38,(EVP_PKEY_CTX *)local_28,(EVP_PKEY_CTX *)0x10);
  SignalActivation::SignalActivation(&local_60,this,(MemberFuncPtr *)local_38);
  if (local_60.end.item != local_60.begin.item) {
    do {
      if (((local_60.begin.item)->value).state == connected) {
        pcVar1 = (code *)((local_60.begin.item)->value).slot.ptr;
        if (((ulong)pcVar1 & 1) != 0) {
          pcVar1 = *(code **)(pcVar1 + *(long *)((long)((local_60.begin.item)->value).object +
                                                *(long *)&((local_60.begin.item)->value).slot.
                                                          field_0x8) + -1);
        }
        (*pcVar1)();
      }
    } while ((local_60.invalidated == false) &&
            (local_60.begin.item = (local_60.begin.item)->next,
            local_60.begin.item != local_60.end.item));
  }
  SignalActivation::~SignalActivation(&local_60);
  return;
}

Assistant:

void emit(void (X::*signal)()) {SignalActivation activation(this, signal); for(List<Slot>::Iterator i = activation.begin; i != activation.end; ++i) {if(i->state == Slot::connected)
      (((X*)i->object)->*((MemberFuncPtr0<X>*)&i->slot)->ptr)(); if(activation.invalidated) return;}}